

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

int lws_humanize(char *p,int len,uint64_t v,lws_humanize_unit_t *schema)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *r;
  char *end;
  lws_humanize_unit_t *schema_local;
  uint64_t v_local;
  int len_local;
  char *p_local;
  
  iVar1 = (int)p + len;
  end = (char *)schema;
  while ((v < *(ulong *)(end + 8) && (*(long *)(end + 8) != 1))) {
    end = end + 0x10;
    if (*(long *)end == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/libwebsockets.c"
                    ,0x4a0,"int lws_humanize(char *, int, uint64_t, const lws_humanize_unit_t *)");
    }
  }
  if (*(long *)(end + 8) == 1) {
    pcVar3 = p + 1;
    *p = ' ';
    iVar2 = decim(pcVar3,v,'\x04','\0');
    p_local._4_4_ =
         lws_snprintf(pcVar3 + iVar2,(long)(iVar1 - (int)(pcVar3 + iVar2)),"%s    ",
                      *(undefined8 *)end);
  }
  else {
    pcVar3 = p + 1;
    *p = ' ';
    iVar2 = decim(pcVar3,v / *(ulong *)(end + 8),'\x04','\0');
    pcVar3 = pcVar3 + iVar2;
    r = pcVar3 + 1;
    *pcVar3 = '.';
    iVar2 = decim(r,(v % *(ulong *)(end + 8)) / (*(ulong *)(end + 8) / 1000),'\x03','\x01');
    p_local._4_4_ = lws_snprintf(r + iVar2,(long)(iVar1 - (int)(r + iVar2)),"%s",*(undefined8 *)end)
    ;
  }
  return p_local._4_4_;
}

Assistant:

int
lws_humanize(char *p, int len, uint64_t v, const lws_humanize_unit_t *schema)
{
	char *end = p + len;

	do {
		if (v >= schema->factor || schema->factor == 1) {
			if (schema->factor == 1) {
				*p++ = ' ';
				p += decim(p, v, 4, 0);
				return lws_snprintf(p, lws_ptr_diff(end, p),
						    "%s    ", schema->name);
			}

			*p++ = ' ';
			p += decim(p, v / schema->factor, 4, 0);
			*p++ = '.';
			p += decim(p, (v % schema->factor) /
					(schema->factor / 1000), 3, 1);

			return lws_snprintf(p, lws_ptr_diff(end, p),
					    "%s", schema->name);
		}
		schema++;
	} while (schema->name);

	assert(0);
	strncpy(p, "unknown value", len);

	return 0;
}